

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O0

void mandelbrot_calc(ImageSize *image,Section *section,int max_iterations,
                    vector<int,_std::allocator<int>_> *iterations_histogram,
                    vector<CalculationResult,_std::allocator<CalculationResult>_> *results_per_point
                    )

{
  value_type vVar1;
  value_type vVar2;
  uint uVar3;
  reference pvVar4;
  float *pfVar5;
  reference pvVar6;
  double dVar7;
  float local_f8;
  float local_f4;
  uint local_f0;
  float fStack_ec;
  double local_e8;
  double xtemp;
  double y_squared;
  double x_squared;
  double dStack_c8;
  int iter;
  double y;
  double x;
  double x0;
  double dStack_a8;
  int pixel_x;
  double y0;
  int local_98;
  int pixel_y;
  int pixel;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  double local_80;
  double final_magnitude;
  double log_2;
  double log_log_bailout;
  double bailout_squared;
  double bailout;
  double y_bottom;
  double y_top;
  double x_right;
  double x_left;
  double width;
  vector<CalculationResult,_std::allocator<CalculationResult>_> *results_per_point_local;
  vector<int,_std::allocator<int>_> *iterations_histogram_local;
  Section *pSStack_18;
  int max_iterations_local;
  Section *section_local;
  ImageSize *image_local;
  
  x_left = section->height * ((double)image->width / (double)image->height);
  x_right = section->center_x + x_left * -0.5;
  y_top = section->center_x + x_left * 0.5;
  y_bottom = section->center_y + section->height * 0.5;
  bailout = section->center_y + section->height * -0.5;
  bailout_squared = 20.0;
  log_log_bailout = 400.0;
  width = (double)results_per_point;
  results_per_point_local =
       (vector<CalculationResult,_std::allocator<CalculationResult>_> *)iterations_histogram;
  iterations_histogram_local._4_4_ = max_iterations;
  pSStack_18 = section;
  section_local = (Section *)image;
  dVar7 = log(20.0);
  log_2 = log(dVar7);
  final_magnitude = log(2.0);
  local_80 = 0.0;
  local_88._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)results_per_point_local);
  _pixel = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)results_per_point_local);
  pixel_y = 0;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_88,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_pixel,
             &pixel_y);
  local_98 = 0;
  y0._4_4_ = 0;
  do {
    if (*(int *)((long)&section_local->center_x + 4) <= y0._4_4_) {
      return;
    }
    dStack_a8 = std::lerp(y_bottom,bailout,
                          (double)y0._4_4_ / (double)*(int *)((long)&section_local->center_x + 4));
    for (x0._4_4_ = 0; x0._4_4_ < *(int *)&section_local->center_x; x0._4_4_ = x0._4_4_ + 1) {
      x = std::lerp(x_right,y_top,(double)x0._4_4_ / (double)*(int *)&section_local->center_x);
      y = 0.0;
      dStack_c8 = 0.0;
      for (x_squared._4_4_ = 0; (int)x_squared._4_4_ < iterations_histogram_local._4_4_;
          x_squared._4_4_ = x_squared._4_4_ + 1) {
        y_squared = y * y;
        xtemp = dStack_c8 * dStack_c8;
        if (400.0 <= y_squared + xtemp) {
          local_80 = sqrt(y_squared + xtemp);
          break;
        }
        local_e8 = (y_squared - xtemp) + x;
        dStack_c8 = y * 2.0 * dStack_c8 + dStack_a8;
        y = local_e8;
      }
      uVar3 = x_squared._4_4_;
      if ((int)x_squared._4_4_ < iterations_histogram_local._4_4_) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)results_per_point_local,
                            (long)(int)x_squared._4_4_);
        *pvVar4 = *pvVar4 + 1;
        local_f0 = x_squared._4_4_;
        local_f4 = 1.0;
        dVar7 = log(local_80);
        dVar7 = log(dVar7);
        local_f8 = (float)((dVar7 - log_2) / final_magnitude);
        pfVar5 = std::min<float>(&local_f4,&local_f8);
        fStack_ec = 1.0 - *pfVar5;
        pvVar6 = std::vector<CalculationResult,_std::allocator<CalculationResult>_>::operator[]
                           ((vector<CalculationResult,_std::allocator<CalculationResult>_> *)width,
                            (long)local_98);
        vVar2.distance_to_next_iteration = fStack_ec;
        vVar2.iter = local_f0;
        *pvVar6 = vVar2;
      }
      else {
        pvVar6 = std::vector<CalculationResult,_std::allocator<CalculationResult>_>::operator[]
                           ((vector<CalculationResult,_std::allocator<CalculationResult>_> *)width,
                            (long)local_98);
        vVar1.distance_to_next_iteration = 0.0;
        vVar1.iter = uVar3;
        *pvVar6 = vVar1;
      }
      local_98 = local_98 + 1;
    }
    y0._4_4_ = y0._4_4_ + 1;
  } while( true );
}

Assistant:

void mandelbrot_calc(const ImageSize& image, const Section& section, const int max_iterations,
                     std::vector<int>& iterations_histogram, std::vector<CalculationResult>& results_per_point) noexcept
{
    const double width = section.height * (static_cast<double>(image.width) / static_cast<double>(image.height));

    const double x_left   = section.center_x - width / 2.0;
    const double x_right  = section.center_x + width / 2.0;
    const double y_top    = section.center_y + section.height / 2.0;
    const double y_bottom = section.center_y - section.height / 2.0;

    constexpr double bailout = 20.0;
    constexpr double bailout_squared = bailout * bailout;
    const double log_log_bailout = std::log(std::log(bailout));
    const double log_2 = std::log(2.0);

    double final_magnitude = 0.0;

    std::fill(iterations_histogram.begin(), iterations_histogram.end(), 0);

    int pixel = 0;

    for (int pixel_y = 0; pixel_y < image.height; ++pixel_y) {
        const double y0 = std::lerp(y_top, y_bottom, static_cast<double>(pixel_y) / static_cast<double>(image.height));

        for (int pixel_x = 0; pixel_x < image.width; ++pixel_x) {
            const double x0 = std::lerp(x_left, x_right, static_cast<double>(pixel_x) / static_cast<double>(image.width));

            double x = 0.0;
            double y = 0.0;

            // iteration, will be from 1 .. max_iterations once the loop is done
            int iter = 0;

            while (iter < max_iterations) {
                const double x_squared = x * x;
                const double y_squared = y * y;

                if (x_squared + y_squared >= bailout_squared) {
                    final_magnitude = std::sqrt(x_squared + y_squared);
                    break;
                }

                const double xtemp = x_squared - y_squared + x0;
                y = 2.0 * x * y + y0;
                x = xtemp;

                ++iter;
            }

            if (iter < max_iterations) {
                ++iterations_histogram[static_cast<std::size_t>(iter)]; // iter: 1 .. max_iterations-1, no need to count iterations_histogram[max_iterations]
                results_per_point[static_cast<std::size_t>(pixel)] = CalculationResult{iter, 1.0f - std::min(1.0f, static_cast<float>((std::log(std::log(final_magnitude)) - log_log_bailout) / log_2))};
            } else {
                results_per_point[static_cast<std::size_t>(pixel)] = CalculationResult{iter, 0.0};
            }

            ++pixel;
        }
    }
}